

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

Complex __thiscall libDAI::TRW::logZ(TRW *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  double *pdVar4;
  undefined4 extraout_var_03;
  ulong uVar5;
  undefined4 extraout_var_04;
  long *plVar6;
  undefined4 extraout_var_05;
  ulong j;
  ulong uVar7;
  double dVar8;
  pointer pVVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Var v_j;
  Var v_i;
  double local_110;
  Var local_f8;
  TFactor<double> local_e0;
  TFactor<double> local_a8;
  Factor local_68;
  undefined1 extraout_var_06 [56];
  
  uVar7 = 0;
  local_110 = 0.0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if (uVar3 <= uVar7) break;
    beliefF(&local_68,this,uVar7);
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    dVar8 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))
                              ((long *)CONCAT44(extraout_var_00,iVar2),uVar7);
    TFactor<double>::log(&local_a8,dVar8);
    TFactor<double>::operator*(&local_e0,&local_68,&local_a8);
    dVar8 = TProb<double>::totalSum(&local_e0._p);
    local_110 = local_110 + dVar8;
    TFactor<double>::~TFactor(&local_e0);
    TFactor<double>::~TFactor(&local_a8);
    TFactor<double>::~TFactor(&local_68);
    uVar7 = uVar7 + 1;
  }
  uVar7 = 0;
  while( true ) {
    uVar3 = uVar7;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    auVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))
                        ((long *)CONCAT44(extraout_var_01,iVar2));
    if (auVar12._0_8_ <= uVar3) break;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    pdVar4 = (double *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x30))
                       ((long *)CONCAT44(extraout_var_02,iVar2),uVar3);
    pVVar9 = (pointer)*pdVar4;
    local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pdVar4[1];
    local_a8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar9;
    beliefV(&local_e0,this,uVar3);
    TProb<double>::entropy(&local_e0._p);
    local_110 = local_110 + (double)pVVar9;
    TFactor<double>::~TFactor(&local_e0);
    j = uVar3 + 1;
    while( true ) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x28))
                        ((long *)CONCAT44(extraout_var_03,iVar2));
      uVar7 = uVar3 + 1;
      if (uVar5 <= j) break;
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x30))
                                 ((long *)CONCAT44(extraout_var_04,iVar2),j);
      local_f8._label = *plVar6;
      local_f8._states = plVar6[1];
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x70))
                (&local_e0,(long *)CONCAT44(extraout_var_05,iVar2),&local_a8);
      bVar1 = VarSet::operator&&(&local_e0._vs,&local_f8);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_e0);
      if (bVar1) {
        dVar8 = rho(this,uVar3,j);
        VarSet::VarSet(&local_68._vs,(Var *)&local_a8,&local_f8);
        (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xb])
                  (&local_e0,this,&local_68);
        auVar10._0_8_ = MutualInfo<double>(&local_e0);
        auVar10._8_56_ = extraout_var_06;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_110;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar8;
        auVar12 = vfnmadd231sd_fma(auVar11,auVar10._0_16_,auVar12);
        local_110 = auVar12._0_8_;
        TFactor<double>::~TFactor(&local_e0);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_68);
      }
      j = j + 1;
    }
  }
  return (Complex)(_ComplexT)auVar12;
}

Assistant:

Complex TRW::logZ() const {
/*        Complex sum = 0.0;
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
        return sum;*/

        Real sum = 0.0;
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum += (beliefF(I) * grm().factor(I).log()).totalSum();
        for( size_t i = 0; i < grm().nrVars(); i++ ) {
            Var v_i = grm().var(i);
            sum += real(beliefV(i).entropy());
            for( size_t j = i+1; j < grm().nrVars(); j++ ) {
                Var v_j = grm().var(j);
                if( grm().delta(v_i) && v_j )
                    sum -= rho(i,j) * MutualInfo( belief( v_i | v_j ) );
            }
        }
        return sum;
    }